

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tl.cpp
# Opt level: O3

void __thiscall pg::TLSolver::attractVertices(TLSolver *this,int pl,int v,bitset *R,bitset *Z)

{
  Game *pGVar1;
  uint64_t *puVar2;
  ulong uVar3;
  uint64_t *puVar4;
  uint *puVar5;
  ulong uVar6;
  ostream *poVar7;
  long lVar8;
  uint uVar9;
  int *piVar10;
  char *pcVar11;
  uint uVar12;
  int *piVar13;
  int iVar14;
  ulong uVar16;
  ulong uVar17;
  _label_vertex local_48;
  uint64_t *local_38;
  ulong uVar15;
  
  pGVar1 = (this->super_Solver).game;
  piVar10 = pGVar1->_inedges;
  iVar14 = pGVar1->_firstins[v];
  uVar9 = piVar10[iVar14];
  if (uVar9 != 0xffffffff) {
    piVar10 = piVar10 + iVar14;
    do {
      puVar2 = Z->_bits;
      uVar6 = (ulong)(int)uVar9;
      uVar16 = uVar6 >> 6;
      uVar17 = 1L << (uVar6 & 0x3f);
      uVar3 = puVar2[uVar16];
      if ((uVar3 >> (uVar6 & 0x3f) & 1) == 0) {
        if ((R->_bits[uVar16] & uVar17) != 0) {
          pGVar1 = (this->super_Solver).game;
          puVar4 = (pGVar1->_owner)._bits;
          if ((uint)((puVar4[uVar16] & uVar17) != 0) != pl) {
            puVar5 = this->escs;
            uVar12 = puVar5[uVar6];
            local_38 = puVar4;
            if (uVar12 == 0) {
              iVar14 = pGVar1->_outedges[pGVar1->_firstouts[uVar6]];
              if (iVar14 == -1) {
                puVar5[uVar6] = 0xffffffff;
                goto LAB_001742b2;
              }
              piVar13 = pGVar1->_outedges + (long)pGVar1->_firstouts[uVar6] + 1;
              uVar12 = 0;
              do {
                uVar15 = (ulong)iVar14;
                iVar14 = *piVar13;
                uVar12 = uVar12 + (((this->G)._bits[uVar15 >> 6] >> (uVar15 & 0x3f) & 1) != 0);
                piVar13 = piVar13 + 1;
              } while (iVar14 != -1);
            }
            puVar5[uVar6] = uVar12 - 1;
            if (uVar12 - 1 != 0) goto LAB_001742b2;
          }
          puVar2[uVar16] = uVar3 | uVar17;
          iVar14 = -1;
          if ((uint)((puVar4[uVar16] & uVar17) != 0) == pl) {
            iVar14 = v;
          }
          this->str[uVar6] = iVar14;
          iVar14 = (this->Q).pointer;
          (this->Q).pointer = iVar14 + 1;
          (this->Q).queue[iVar14] = uVar9;
          if (2 < (this->super_Solver).trace) {
            poVar7 = (this->super_Solver).logger;
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar7,"\x1b[1;37mattracted \x1b[36m",0x16);
            local_48.g = (this->super_Solver).game;
            local_48.v = uVar9;
            poVar7 = operator<<(poVar7,&local_48);
            std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\x1b[m by \x1b[1;36m",0xe);
            poVar7 = (ostream *)std::ostream::operator<<(poVar7,pl);
            std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\x1b[m",3);
            poVar7 = (this->super_Solver).logger;
            if ((uint)(((((this->super_Solver).game)->_owner)._bits[uVar16] & uVar17) != 0) == pl) {
              std::__ostream_insert<char,std::char_traits<char>>(poVar7," (via ",6);
              local_48.g = (this->super_Solver).game;
              local_48.v = v;
              poVar7 = operator<<(poVar7,&local_48);
              lVar8 = 1;
              pcVar11 = ")";
            }
            else {
              lVar8 = 9;
              pcVar11 = " (forced)";
            }
            std::__ostream_insert<char,std::char_traits<char>>(poVar7,pcVar11,lVar8);
            std::ios::widen((char)poVar7->_vptr_basic_ostream[-3] + (char)poVar7);
            std::ostream::put((char)poVar7);
            std::ostream::flush();
          }
        }
      }
      else if (((uint)(((((this->super_Solver).game)->_owner)._bits[uVar16] & uVar17) != 0) == pl)
              && (this->str[uVar6] == -1)) {
        this->str[uVar6] = v;
      }
LAB_001742b2:
      uVar9 = piVar10[1];
      piVar10 = piVar10 + 1;
    } while (uVar9 != 0xffffffff);
  }
  return;
}

Assistant:

void
TLSolver::attractVertices(const int pl, const int v, bitset &R, bitset &Z)
{
    // attract vertices with an edge to <v>
    for (auto curedge = ins(v); *curedge != -1; curedge++) {
        int from = *curedge;
        if (Z[from]) {
            // already in Z, maybe set strategy (for vertices in the original target set)
            if (owner(from) == pl and str[from] == -1) str[from] = v;
        } else if (R[from]) {
            if (owner(from) != pl) {
                // check if opponent can escape
                unsigned int e = escs[from];
                if (e == 0) {
                    for (auto curedge = outs(from); *curedge != -1; curedge++) {
                        if (G[*curedge]) e++;
                    }
                }
                escs[from] = --e;
                if (e > 0) continue; // escapes
            }
            // attract
            Z[from] = true;
            str[from] = owner(from) == pl ? v : -1;
            Q.push(from);
#ifndef NDEBUG
            // maybe report event
            if (trace >= 3) {
                logger << "\033[1;37mattracted \033[36m" << label_vertex(from) << "\033[m by \033[1;36m" << pl << "\033[m";
                if (owner(from) == pl) logger << " (via " << label_vertex(v) << ")" << std::endl;
                else logger << " (forced)" << std::endl;
            }
#endif
        }
    }
}